

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsDatabase.cpp
# Opt level: O1

bool DnsDatabase::resolve(String *hostname,uint32 *addr)

{
  bool bVar1;
  Iterator IVar2;
  time_t tVar3;
  AddrInfo *value;
  byte unaff_BPL;
  String *pSVar4;
  String *pSVar5;
  String *pSVar6;
  Iterator it;
  AddrInfo addrInfo;
  Iterator local_38;
  uint32 local_30;
  char *local_28;
  
  pSVar6 = (String *)&stack0xffffffffffffffc8;
  pSVar4 = (String *)addr;
  Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
  pSVar5 = hostname;
  IVar2 = HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                    ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,pSVar4);
  if (IVar2.item == (anonymous_namespace)::_nameToAddr) {
    bVar1 = true;
  }
  else {
    *addr = ((IVar2.item)->value).addr;
    unaff_BPL = ((IVar2.item)->value).addr != 0;
    tVar3 = Time::time((time_t *)pSVar5);
    bVar1 = 600000 < tVar3 - ((IVar2.item)->value).timestamp;
  }
  Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
  if (bVar1) {
    pSVar4 = (String *)addr;
    unaff_BPL = Socket::getHostByName(hostname,addr);
    Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
    pSVar5 = hostname;
    local_38 = HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                         ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,pSVar4);
    if (local_38.item != (anonymous_namespace)::_nameToAddr) {
      if (((local_38.item)->value).addr != 0) {
        pSVar4 = (String *)&(local_38.item)->value;
        HashMap<unsigned_int,_String>::remove
                  ((HashMap<unsigned_int,_String> *)&(anonymous_namespace)::_addrToName,
                   (char *)pSVar4);
      }
      HashMap<String,_(anonymous_namespace)::AddrInfo>::remove
                ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)&stack0xffffffffffffffc8,
                 (char *)pSVar4);
      pSVar5 = pSVar6;
    }
    local_30 = 0;
    if ((bool)unaff_BPL) {
      local_30 = *addr;
    }
    local_28 = (char *)Time::time((time_t *)pSVar5);
    HashMap<String,_(anonymous_namespace)::AddrInfo>::append
              ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)hostname,
               (String *)&stack0xffffffffffffffd0,value);
    if ((bool)unaff_BPL) {
      HashMap<unsigned_int,_String>::insert
                ((HashMap<unsigned_int,_String> *)&(anonymous_namespace)::_addrToName,
                 (Iterator *)&(anonymous_namespace)::_addrToName,addr,hostname);
    }
    Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool DnsDatabase::resolve(const String& hostname, uint32& addr)
{
    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            const AddrInfo& addrInfo = *it;
            addr = addrInfo.addr;
            bool result = addrInfo.addr != 0;
            if (Time::time() - addrInfo.timestamp <= 10 * 60 * 1000) // the cached entry should not be older than 10 minutes
            {
                _mutex.unlock();
                return result;
            }
        }
        _mutex.unlock();
    }

    bool result = Socket::getHostByName(hostname, addr);

    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            if (it->addr != 0)
                _addrToName.remove(it->addr);
            _nameToAddr.remove(it);
        }
        AddrInfo addrInfo = {result ? addr : 0, Time::time()};
        _nameToAddr.append(hostname, addrInfo);
        if (result)
            _addrToName.append(addr, hostname);
        _mutex.unlock();
    }

    return result;
}